

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_atlas_clear(nk_font_atlas *atlas)

{
  long in_RDI;
  nk_font *next_1;
  nk_font *iter_1;
  nk_font_config *n;
  nk_font_config *i;
  nk_font_config *next;
  nk_font_config *iter;
  undefined8 *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined8 *puVar1;
  undefined8 *local_20;
  undefined8 *local_10;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x18) != 0)) && (*(long *)(in_RDI + 0x20) != 0)) {
    if (*(long *)(in_RDI + 0x180) != 0) {
      local_10 = *(undefined8 **)(in_RDI + 0x180);
      while (local_10 != (undefined8 *)0x0) {
        local_20 = (undefined8 *)local_10[9];
        while (local_20 != local_10) {
          puVar1 = (undefined8 *)local_20[9];
          if (local_20[1] != 0) {
            (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),local_20[1]);
          }
          (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),local_20);
          local_20 = puVar1;
        }
        puVar1 = (undefined8 *)*local_10;
        if (local_20[1] != 0) {
          (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),local_10[1]);
        }
        (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),local_10);
        local_10 = puVar1;
      }
      *(undefined8 *)(in_RDI + 0x180) = 0;
    }
    if (*(long *)(in_RDI + 0x178) != 0) {
      puVar1 = *(undefined8 **)(in_RDI + 0x178);
      while (puVar1 != (undefined8 *)0x0) {
        in_stack_ffffffffffffffc8 = (undefined8 *)*puVar1;
        (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),puVar1);
        puVar1 = in_stack_ffffffffffffffc8;
      }
      *(undefined8 *)(in_RDI + 0x178) = 0;
      in_stack_ffffffffffffffd0 = (void *)0x0;
    }
    if (*(long *)(in_RDI + 0x168) != 0) {
      (**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x10),*(undefined8 *)(in_RDI + 0x168));
    }
    nk_zero(in_stack_ffffffffffffffd0,(nk_size)in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

NK_API void
nk_font_atlas_clear(struct nk_font_atlas *atlas)
{
NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);
if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;

if (atlas->config) {
struct nk_font_config *iter, *next;
for (iter = atlas->config; iter; iter = next) {
struct nk_font_config *i, *n;
for (i = iter->n; i != iter; i = n) {
n = i->n;
if (i->ttf_blob)
atlas->permanent.free(atlas->permanent.userdata, i->ttf_blob);
atlas->permanent.free(atlas->permanent.userdata, i);
}
next = iter->next;
if (i->ttf_blob)
atlas->permanent.free(atlas->permanent.userdata, iter->ttf_blob);
atlas->permanent.free(atlas->permanent.userdata, iter);
}
atlas->config = 0;
}
if (atlas->fonts) {
struct nk_font *iter, *next;
for (iter = atlas->fonts; iter; iter = next) {
next = iter->next;
atlas->permanent.free(atlas->permanent.userdata, iter);
}
atlas->fonts = 0;
}
if (atlas->glyphs)
atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
nk_zero_struct(*atlas);
}